

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

If_Grp_t *
If_CluCheck3(If_Grp_t *__return_storage_ptr__,If_Man_t *p,word *pTruth0,int nVars,int nLutLeaf,
            int nLutLeaf2,int nLutRoot,If_Grp_t *pR,If_Grp_t *pG2,word *pFunc0,word *pFunc1,
            word *pFunc2)

{
  char cVar1;
  char cVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  undefined4 in_register_0000000c;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  char cVar9;
  int iVarStop;
  If_Grp_t R;
  If_Grp_t local_2162;
  If_Grp_t *local_2150;
  If_Grp_t local_2148;
  If_Man_t *local_2128;
  ulong local_2120;
  If_Grp_t R2;
  word Func1;
  word Func0;
  word Func2_1;
  word Func1_1;
  word Func2;
  int P2V [18];
  word pLeftOver [1024];
  
  local_2120 = CONCAT44(in_register_0000000c,nVars);
  local_2148.pVars[0xe] = '\0';
  local_2148.pVars[0xf] = '\0';
  local_2148.nVars = '\0';
  local_2148.nMyu = '\0';
  local_2148.pVars[0] = '\0';
  local_2148.pVars[1] = '\0';
  local_2148.pVars[2] = '\0';
  local_2148.pVars[3] = '\0';
  local_2148.pVars[4] = '\0';
  local_2148.pVars[5] = '\0';
  local_2148.pVars[6] = '\0';
  local_2148.pVars[7] = '\0';
  local_2148.pVars[8] = '\0';
  local_2148.pVars[9] = '\0';
  local_2148.pVars[10] = '\0';
  local_2148.pVars[0xb] = '\0';
  local_2148.pVars[0xc] = '\0';
  local_2148.pVars[0xd] = '\0';
  R.pVars[0xe] = '\0';
  R.pVars[0xf] = '\0';
  R.nVars = '\0';
  R.nMyu = '\0';
  R.pVars[0] = '\0';
  R.pVars[1] = '\0';
  R.pVars[2] = '\0';
  R.pVars[3] = '\0';
  R.pVars[4] = '\0';
  R.pVars[5] = '\0';
  R.pVars[6] = '\0';
  R.pVars[7] = '\0';
  R.pVars[8] = '\0';
  R.pVars[9] = '\0';
  R.pVars[10] = '\0';
  R.pVars[0xb] = '\0';
  R.pVars[0xc] = '\0';
  R.pVars[0xd] = '\0';
  R2.pVars[0xe] = '\0';
  R2.pVars[0xf] = '\0';
  R2.nVars = '\0';
  R2.nMyu = '\0';
  R2.pVars[0] = '\0';
  R2.pVars[1] = '\0';
  R2.pVars[2] = '\0';
  R2.pVars[3] = '\0';
  R2.pVars[4] = '\0';
  R2.pVars[5] = '\0';
  R2.pVars[6] = '\0';
  R2.pVars[7] = '\0';
  R2.pVars[8] = '\0';
  R2.pVars[9] = '\0';
  R2.pVars[10] = '\0';
  R2.pVars[0xb] = '\0';
  R2.pVars[0xc] = '\0';
  R2.pVars[0xd] = '\0';
  If_CluCheck3::Counter = If_CluCheck3::Counter + 1;
  s_Count3 = s_Count3 + 1;
  local_2150 = __return_storage_ptr__;
  local_2128 = p;
  If_CluCheck(&local_2162,p,pTruth0,nVars,0,0,nLutLeaf,nLutLeaf2 + nLutRoot + -1,&R2,&Func0,&Func1,
              pLeftOver,0);
  uVar6 = local_2120;
  if (local_2162.nVars == '\0') {
    if (((nLutLeaf == nLutLeaf2) && ((byte)(local_2162.nMyu - 3U) < 2)) &&
       (iVar4 = (int)local_2120, (iVar4 - nLutLeaf2) + 2 <= nLutRoot)) {
      local_2162.nVars = (char)nLutLeaf2;
      uVar5 = 1 << ((char)local_2120 - 6U & 0x1f);
      if (iVar4 < 7) {
        uVar5 = 1;
      }
      local_2128 = (If_Man_t *)pTruth0;
      if (0 < (int)uVar5) {
        memcpy(pLeftOver,pTruth0,(ulong)uVar5 << 3);
      }
      if (0 < iVar4) {
        uVar7 = 0;
        do {
          P2V[uVar7] = (int)uVar7;
          *(int *)((long)&Func2 + uVar7 * 4) = (int)uVar7;
          uVar7 = uVar7 + 1;
        } while ((uVar6 & 0xffffffff) != uVar7);
      }
      If_CluMoveGroupToMsb(pLeftOver,iVar4,(int *)&Func2,P2V,&local_2162);
      If_CluDeriveDisjoint4(pLeftOver,iVar4,(int *)&Func1_1,P2V,&local_2162,&R,&Func1_1,&Func2_1);
      cVar9 = R.nVars;
      uVar5 = (uint)R.nVars;
      lVar8 = (long)(int)uVar5;
      if ('\0' < R.nVars) {
        uVar6 = 0;
        do {
          P2V[uVar6] = (int)uVar6;
          *(int *)((long)&Func2 + uVar6 * 4) = (int)uVar6;
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      If_CluMoveVar(pLeftOver,uVar5,(int *)&Func2,P2V,uVar5 - 2,0);
      If_CluMoveVar(pLeftOver,uVar5,(int *)&Func2,P2V,(int)(lVar8 - 1U),1);
      uVar3 = R._0_8_;
      cVar1 = R.pVars[lVar8 + -2];
      cVar2 = R.pVars[lVar8 + -1];
      if ('\x02' < cVar9) {
        uVar6 = (lVar8 - 1U & 0xffffffff) + 1;
        do {
          R.pVars[uVar6 - 1] = (&stack0xffffffffffffde87)[uVar6];
          uVar6 = uVar6 - 1;
        } while (2 < uVar6);
      }
      R.pVars[0] = cVar1;
      R.pVars._2_4_ = SUB84(uVar3,4);
      R.pVars[1] = cVar2;
      If_CluVerify3((word *)local_2128,iVar4,&local_2162,&local_2162,&R,Func1_1,Func2_1,pLeftOver[0]
                   );
      if (pFunc2 != (word *)0x0 && pFunc1 != (word *)0x0) {
        *pFunc0 = pLeftOver[0];
        *pFunc1 = Func1_1;
        *pFunc2 = Func2_1;
        *(undefined2 *)(pG2->pVars + 0xe) = local_2162.pVars._14_2_;
        pG2->nVars = local_2162.nVars;
        pG2->nMyu = local_2162.nMyu;
        pG2->pVars[0] = local_2162.pVars[0];
        pG2->pVars[1] = local_2162.pVars[1];
        pG2->pVars[2] = local_2162.pVars[2];
        pG2->pVars[3] = local_2162.pVars[3];
        pG2->pVars[4] = local_2162.pVars[4];
        pG2->pVars[5] = local_2162.pVars[5];
        *(ulong *)(pG2->pVars + 6) = CONCAT44(local_2162.pVars._10_4_,local_2162.pVars._6_4_);
        *(undefined2 *)(pR->pVars + 0xe) = R.pVars._14_2_;
        pR->nVars = R.nVars;
        pR->nMyu = R.nMyu;
        pR->pVars[0] = R.pVars[0];
        pR->pVars[1] = R.pVars[1];
        pR->pVars[2] = R.pVars[2];
        pR->pVars[3] = R.pVars[3];
        pR->pVars[4] = R.pVars[4];
        pR->pVars[5] = R.pVars[5];
        *(undefined8 *)(pR->pVars + 6) = R.pVars._6_8_;
      }
    }
  }
  else if (nLutRoot < R2.nVars) {
    iVar4 = local_2128->pPars->nStructType;
    if (iVar4 == 2) {
      iVar4 = 0;
      iVarStop = 1;
    }
    else {
      if (iVar4 == 1) {
        iVar4 = 1;
      }
      else {
        if (iVar4 != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                        ,0x7ec,
                        "If_Grp_t If_CluCheck3(If_Man_t *, word *, int, int, int, int, If_Grp_t *, If_Grp_t *, word *, word *, word *)"
                       );
        }
        iVar4 = 0;
      }
      iVarStop = 0;
    }
    If_CluCheck(&local_2148,local_2128,pLeftOver,(int)R2.nVars,iVar4,iVarStop,nLutLeaf2,nLutRoot,&R,
                &Func0,&Func2,(word *)0x0,0);
    uVar6 = local_2120;
    if ((local_2148._0_8_ & 0xff) == 0) {
      *(undefined2 *)(local_2150->pVars + 0xe) = local_2148.pVars._14_2_;
      local_2162.pVars._2_4_ = local_2148.pVars._2_4_;
      local_2162.pVars._6_4_ = local_2148.pVars._6_4_;
      local_2162.pVars._10_4_ = local_2148.pVars._10_4_;
      goto LAB_0041af22;
    }
    if ('\0' < local_2148.nVars) {
      cVar9 = R2.nVars;
      uVar7 = 0;
      do {
        if (cVar9 <= local_2148.pVars[uVar7]) {
          __assert_fail("G2.pVars[i] < R2.nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                        ,0x7f7,
                        "If_Grp_t If_CluCheck3(If_Man_t *, word *, int, int, int, int, If_Grp_t *, If_Grp_t *, word *, word *, word *)"
                       );
        }
        local_2148.pVars[uVar7] = R2.pVars[local_2148.pVars[uVar7]];
        uVar7 = uVar7 + 1;
      } while ((local_2148._0_8_ & 0xff) != uVar7);
    }
    if (0 < (long)R.nVars) {
      lVar8 = 0;
      do {
        cVar9 = (char)uVar6 + '\x01';
        if (R.pVars[lVar8] != R2.nVars) {
          cVar9 = R2.pVars[R.pVars[lVar8]];
        }
        R.pVars[lVar8] = cVar9;
        lVar8 = lVar8 + 1;
      } while (R.nVars != lVar8);
    }
    if (pG2 != (If_Grp_t *)0x0) {
      *(undefined2 *)(pG2->pVars + 0xe) = local_2148.pVars._14_2_;
      pG2->nVars = local_2148.nVars;
      pG2->nMyu = local_2148.nMyu;
      pG2->pVars[0] = local_2148.pVars[0];
      pG2->pVars[1] = local_2148.pVars[1];
      pG2->pVars[2] = local_2148.pVars[2];
      pG2->pVars[3] = local_2148.pVars[3];
      pG2->pVars[4] = local_2148.pVars[4];
      pG2->pVars[5] = local_2148.pVars[5];
      *(undefined8 *)(pG2->pVars + 6) = local_2148.pVars._6_8_;
    }
    if (pR != (If_Grp_t *)0x0) {
      *(undefined2 *)(pR->pVars + 0xe) = R.pVars._14_2_;
      pR->nVars = R.nVars;
      pR->nMyu = R.nMyu;
      pR->pVars[0] = R.pVars[0];
      pR->pVars[1] = R.pVars[1];
      pR->pVars[2] = R.pVars[2];
      pR->pVars[3] = R.pVars[3];
      pR->pVars[4] = R.pVars[4];
      pR->pVars[5] = R.pVars[5];
      *(undefined8 *)(pR->pVars + 6) = R.pVars._6_8_;
    }
    if (pFunc0 != (word *)0x0) {
      *pFunc0 = Func0;
    }
    if (pFunc1 != (word *)0x0) {
      *pFunc1 = Func1;
    }
    if (pFunc2 != (word *)0x0) {
      *pFunc2 = Func2;
    }
  }
  else {
    if (pG2 != (If_Grp_t *)0x0) {
      pG2->nVars = '\0';
      pG2->nMyu = '\0';
      pG2->pVars[0] = '\0';
      pG2->pVars[1] = '\0';
      pG2->pVars[2] = '\0';
      pG2->pVars[3] = '\0';
      pG2->pVars[4] = '\0';
      pG2->pVars[5] = '\0';
      pG2->pVars[6] = '\0';
      pG2->pVars[7] = '\0';
      pG2->pVars[8] = '\0';
      pG2->pVars[9] = '\0';
      pG2->pVars[10] = '\0';
      pG2->pVars[0xb] = '\0';
      pG2->pVars[0xc] = '\0';
      pG2->pVars[0xd] = '\0';
      pG2->pVars[0xe] = '\0';
      pG2->pVars[0xf] = '\0';
    }
    if (pR != (If_Grp_t *)0x0) {
      *(undefined2 *)(pR->pVars + 0xe) = R2.pVars._14_2_;
      pR->nVars = R2.nVars;
      pR->nMyu = R2.nMyu;
      pR->pVars[0] = R2.pVars[0];
      pR->pVars[1] = R2.pVars[1];
      pR->pVars[2] = R2.pVars[2];
      pR->pVars[3] = R2.pVars[3];
      pR->pVars[4] = R2.pVars[4];
      pR->pVars[5] = R2.pVars[5];
      *(undefined8 *)(pR->pVars + 6) = R2.pVars._6_8_;
    }
    if (pFunc0 != (word *)0x0) {
      *pFunc0 = Func0;
    }
    if (pFunc1 != (word *)0x0) {
      *pFunc1 = Func1;
    }
    if (pFunc2 != (word *)0x0) {
      *pFunc2 = 0;
    }
  }
  *(undefined2 *)(local_2150->pVars + 0xe) = local_2162.pVars._14_2_;
  local_2148.nMyu = local_2162.nMyu;
  local_2148.nVars = local_2162.nVars;
  local_2148.pVars[0] = local_2162.pVars[0];
  local_2148.pVars[1] = local_2162.pVars[1];
LAB_0041af22:
  local_2150->nVars = local_2148.nVars;
  local_2150->nMyu = local_2148.nMyu;
  local_2150->pVars[0] = local_2148.pVars[0];
  local_2150->pVars[1] = local_2148.pVars[1];
  *(undefined4 *)(local_2150->pVars + 2) = local_2162.pVars._2_4_;
  *(undefined4 *)(local_2150->pVars + 6) = local_2162.pVars._6_4_;
  *(undefined4 *)(local_2150->pVars + 10) = local_2162.pVars._10_4_;
  return local_2150;
}

Assistant:

If_Grp_t If_CluCheck3( If_Man_t * p, word * pTruth0, int nVars, int nLutLeaf, int nLutLeaf2, int nLutRoot, 
                      If_Grp_t * pR, If_Grp_t * pG2, word * pFunc0, word * pFunc1, word * pFunc2 )
{
    int fEnableHashing = 0;
    static int Counter = 0;
    unsigned * pHashed = NULL;
    word pLeftOver[CLU_WRD_MAX], Func0, Func1, Func2;
    If_Grp_t G1 = {0}, G2 = {0}, R = {0}, R2 = {0};
    int i;
    Counter++;
//    if ( Counter == 37590 )
//    {
//        int ns = 0;
//    }

    // check hash table
    if ( p && fEnableHashing )
    {
        pHashed = If_CluHashLookup( p, pTruth0, 1 );
        if ( pHashed && *pHashed != CLU_UNUSED )
        {
            If_CluUns2Grp( *pHashed, &G1 );
            return G1;
        }
    }
    s_Count3++;

    // check two-node decomposition
    G1 = If_CluCheck( p, pTruth0, nVars, 0, 0, nLutLeaf, nLutRoot + nLutLeaf2 - 1, &R2, &Func0, &Func1, pLeftOver, 0 );
    // decomposition does not exist
    if ( G1.nVars == 0 )
    {
        // check for decomposition with two outputs
        if ( (G1.nMyu == 3 || G1.nMyu == 4) && nLutLeaf == nLutLeaf2 && nVars - nLutLeaf + 2 <= nLutRoot )
        {
            int V2P[CLU_VAR_MAX+2], P2V[CLU_VAR_MAX+2];
            word Func0, Func1, Func2;
            int iVar0, iVar1;

            G1.nVars = nLutLeaf;
            If_CluCopy( pLeftOver, pTruth0, nVars );
            for ( i = 0; i < nVars; i++ )
                V2P[i] = P2V[i] = i;

            If_CluMoveGroupToMsb( pLeftOver, nVars, V2P, P2V, &G1 );
            If_CluDeriveDisjoint4( pLeftOver, nVars, V2P, P2V, &G1, &R, &Func1, &Func2 );

            // move the two vars to the front
            for ( i = 0; i < R.nVars; i++ )
                V2P[i] = P2V[i] = i;
            If_CluMoveVar( pLeftOver, R.nVars, V2P, P2V, R.nVars-2, 0 );
            If_CluMoveVar( pLeftOver, R.nVars, V2P, P2V, R.nVars-1, 1 );
            iVar0 = R.pVars[R.nVars-2];
            iVar1 = R.pVars[R.nVars-1];
            for ( i = R.nVars-1; i > 1; i-- )
                R.pVars[i] = R.pVars[i-2];
            R.pVars[0] = iVar0;
            R.pVars[1] = iVar1;

            Func0 = pLeftOver[0];
            If_CluVerify3( pTruth0, nVars, &G1, &G1, &R, Func1, Func2, Func0 );
            if ( pFunc1 && pFunc2 )
            {
                *pFunc0 = Func0;
                *pFunc1 = Func1;
                *pFunc2 = Func2;
                *pG2 = G1;
                *pR = R;
            }

            if ( pHashed )
                *pHashed = If_CluGrp2Uns( &G1 );
//                Kit_DsdPrintFromTruth( (unsigned*)pTruth0, nVars );  printf( "\n" );
//                If_CluPrintGroup( &G1 );
            return G1;
        }

/*
//        if ( nVars == 6 )
        {
//            Extra_PrintHex( stdout, (unsigned *)pTruth0, nVars );  printf( "    " );
            Kit_DsdPrintFromTruth( (unsigned*)pTruth0, nVars );  printf( "\n" );
            if ( p != NULL )
            If_CluCheck3( NULL, pTruth0, nVars, nLutLeaf, nLutLeaf2, nLutRoot, pR, pG2, pFunc0, pFunc1, pFunc2 );
        } 
*/
        if ( pHashed )
            *pHashed = If_CluGrp2Uns( &G1 );
        return G1;
    }
    // decomposition exists and sufficient
    if ( R2.nVars <= nLutRoot )
    {
        if ( pG2 )     *pG2 = G2;
        if ( pR )      *pR  = R2;
        if ( pFunc0 )  *pFunc0 = Func0;
        if ( pFunc1 )  *pFunc1 = Func1;
        if ( pFunc2 )  *pFunc2 = 0;
        if ( pHashed )
            *pHashed = If_CluGrp2Uns( &G1 );
        return G1;
    }

    // try second decomposition
    {
        int Test = 0;
        if ( Test )
        {
            Kit_DsdPrintFromTruth( (unsigned*)&pLeftOver, R2.nVars ); printf( "\n" );
        }
    }

    // the new variable is at the bottom - skip it (iVarStart = 1)
    if ( p->pPars->nStructType == 0 ) // allowed
        G2 = If_CluCheck( p, pLeftOver, R2.nVars, 0, 0, nLutLeaf2, nLutRoot, &R, &Func0, &Func2, NULL, 0 );
    else if ( p->pPars->nStructType == 1 ) // not allowed
        G2 = If_CluCheck( p, pLeftOver, R2.nVars, 1, 0, nLutLeaf2, nLutRoot, &R, &Func0, &Func2, NULL, 0 );
    else if ( p->pPars->nStructType == 2 ) // required
        G2 = If_CluCheck( p, pLeftOver, R2.nVars, 0, 1, nLutLeaf2, nLutRoot, &R, &Func0, &Func2, NULL, 0 );
    else assert( 0 );

    if ( G2.nVars == 0 )
    {
        if ( pHashed )
            *pHashed = If_CluGrp2Uns( &G2 );
        return G2;
    }
    // remap variables
    for ( i = 0; i < G2.nVars; i++ )
    {
        assert( G2.pVars[i] < R2.nVars );
        G2.pVars[i] = R2.pVars[ (int)G2.pVars[i] ];
    }
    // remap variables
    for ( i = 0; i < R.nVars; i++ )
    {
        if ( R.pVars[i] == R2.nVars )
            R.pVars[i] = nVars + 1;
        else
            R.pVars[i] = R2.pVars[ (int)R.pVars[i] ];
    }

    // decomposition exist
    if ( pG2 )     *pG2 = G2;
    if ( pR )      *pR  = R;
    if ( pFunc0 )  *pFunc0 = Func0;
    if ( pFunc1 )  *pFunc1 = Func1;
    if ( pFunc2 )  *pFunc2 = Func2;
    if ( pHashed )
        *pHashed = If_CluGrp2Uns( &G1 );

    // verify
//    If_CluVerify3( pTruth0, nVars, &G1, &G2, &R, Func1, Func2, Func0 );
    return G1;
}